

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void __thiscall deqp::gls::FboUtil::addFormats(FboUtil *this,FormatDB *db,FormatEntries stdFmts)

{
  _Base_ptr p_Var1;
  FormatEntry *it;
  
  for (; db != (FormatDB *)stdFmts.m_begin;
      db = (FormatDB *)&(db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    for (p_Var1 = *(_Base_ptr *)&(db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var1 != (db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var1 = (_Base_ptr)&p_Var1->field_0x4) {
      FormatDB::addCoreFormat
                ((FormatDB *)this,
                 (ImageFormat)
                 (CONCAT44(p_Var1->_M_color >> 0x10,p_Var1->_M_color) & 0xffffffff0000ffff),
                 *(FormatFlags *)&(db->m_formatFlags)._M_t._M_impl);
    }
  }
  return;
}

Assistant:

void addFormats (FormatDB& db, FormatEntries stdFmts)
{
	for (const FormatEntry* it = stdFmts.begin(); it != stdFmts.end(); it++)
	{
		for (const FormatKey* it2 = it->second.begin(); it2 != it->second.end(); it2++)
			db.addCoreFormat(formatKeyInfo(*it2), it->first);
	}
}